

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O2

void CompoundFile::loadMSATSector
               (istream *stream,
               vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *msat,
               SecID *nextMSATSectorID,int32_t sectorSize)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int32_t secID;
  SecID local_44;
  SecID *local_40;
  int32_t nextSecID;
  
  uVar1 = (long)(sectorSize + -4) / 4;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = uVar1 & 0xffffffff;
  }
  local_40 = nextMSATSectorID;
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    secID = 0;
    readData<int>(stream,&secID,4);
    local_44.m_id = secID;
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
    emplace_back<CompoundFile::SecID>(msat,&local_44);
  }
  nextSecID = 0;
  readData<int>(stream,&nextSecID,4);
  local_40->m_id = nextSecID;
  return;
}

Assistant:

inline void
loadMSATSector( std::istream & stream, std::vector< SecID > & msat,
	SecID & nextMSATSectorID, int32_t sectorSize )
{
	const int32_t secIDCount = ( sectorSize - 4 ) / 4;

	for( int32_t i = 0; i < secIDCount; ++i )
	{
		int32_t secID = 0;

		readData( stream, secID, 4 );

		msat.push_back( secID );
	}

	int32_t nextSecID = 0;

	readData( stream, nextSecID, 4 );

	nextMSATSectorID = nextSecID;
}